

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::LoopPeelingPass::LoopPeelingInfo::GetFirstNonLoopInvariantOperand
          (LoopPeelingInfo *this,Instruction *condition)

{
  IRContext *this_00;
  bool bVar1;
  uint32_t uVar2;
  BasicBlock *bb_00;
  BasicBlock *bb;
  uint32_t i;
  Instruction *condition_local;
  LoopPeelingInfo *this_local;
  
  bb._4_4_ = 0;
  while( true ) {
    uVar2 = Instruction::NumInOperands(condition);
    if (uVar2 <= bb._4_4_) {
      return 0;
    }
    this_00 = this->context_;
    uVar2 = Instruction::GetSingleWordInOperand(condition,bb._4_4_);
    bb_00 = IRContext::get_instr_block(this_00,uVar2);
    if ((bb_00 == (BasicBlock *)0x0) || (bVar1 = Loop::IsInsideLoop(this->loop_,bb_00), !bVar1))
    break;
    bb._4_4_ = bb._4_4_ + 1;
  }
  uVar2 = Instruction::GetSingleWordInOperand(condition,bb._4_4_);
  return uVar2;
}

Assistant:

uint32_t LoopPeelingPass::LoopPeelingInfo::GetFirstNonLoopInvariantOperand(
    Instruction* condition) const {
  for (uint32_t i = 0; i < condition->NumInOperands(); i++) {
    BasicBlock* bb =
        context_->get_instr_block(condition->GetSingleWordInOperand(i));
    if (!bb || !loop_->IsInsideLoop(bb)) {
      return condition->GetSingleWordInOperand(i);
    }
  }

  return 0;
}